

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O3

void CheckListUsage(TidyDocImpl *doc,Node *node)

{
  TidyTagId TVar1;
  Dict *pDVar2;
  uint code;
  
  if (node == (Node *)0x0) {
    return;
  }
  if (((doc->access).PRIORITYCHK & 0xfffffffeU) != 2) {
    return;
  }
  pDVar2 = node->tag;
  if (pDVar2 == (Dict *)0x0) {
    return;
  }
  if (pDVar2->id == TidyTag_OL) {
    code = 0x2be;
  }
  else {
    if (pDVar2->id != TidyTag_UL) {
      if (pDVar2->id != TidyTag_LI) {
        return;
      }
      code = 0x2bf;
      if (((node->parent != (Node *)0x0) && (pDVar2 = node->parent->tag, pDVar2 != (Dict *)0x0)) &&
         ((TVar1 = pDVar2->id, TVar1 == TidyTag_UL || (TVar1 == TidyTag_OL)))) {
        if (node->implicit == no) {
          return;
        }
        prvTidyReportAccessError(doc,node,(TVar1 != TidyTag_UL) + 0x2bd);
        return;
      }
      goto code_r0x0014e57c;
    }
    code = 0x2bd;
  }
  if ((((node->content != (Node *)0x0) && (pDVar2 = node->content->tag, pDVar2 != (Dict *)0x0)) &&
      (pDVar2->id == TidyTag_LI)) && (code = 0x2bf, node->implicit == no)) {
    return;
  }
code_r0x0014e57c:
  prvTidyReport(doc,(Node *)0x0,node,code);
  return;
}

Assistant:

static void CheckListUsage( TidyDocImpl* doc, Node* node )
{
    int msgcode = 0;

    if (!Level2_Enabled( doc ))
        return;

    if ( nodeIsOL(node) )
        msgcode = LIST_USAGE_INVALID_OL;
    else if ( nodeIsUL(node) )
        msgcode = LIST_USAGE_INVALID_UL;

    if ( msgcode )
    {
       /*
       ** Check that OL/UL
       ** a) has LI child,
       ** b) was not added by Tidy parser
       ** IFF OL/UL node is implicit
       */
       if ( !nodeIsLI(node->content) ) {
            TY_(ReportAccessError)( doc, node, msgcode );
       } else if ( node->implicit ) {  /* if a tidy added node */
            TY_(ReportAccessError)( doc, node, LIST_USAGE_INVALID_LI );
       }
    }
    else if ( nodeIsLI(node) )
    {
        /* Check that LI parent 
        ** a) exists,
        ** b) is either OL or UL
        ** IFF the LI parent was added by Tidy
        ** ie, if it is marked 'implicit', then
        ** emit warnings LIST_USAGE_INVALID_UL or 
        ** warning LIST_USAGE_INVALID_OL tests 
        */
        if ( node->parent == NULL ||
             ( !nodeIsOL(node->parent) && !nodeIsUL(node->parent) ) )
        {
            TY_(ReportAccessError)( doc, node, LIST_USAGE_INVALID_LI );
        } else if ( node->implicit && node->parent &&
                    ( nodeIsOL(node->parent) || nodeIsUL(node->parent) ) ) {
            /* if tidy added LI node, then */
            msgcode = nodeIsUL(node->parent) ?
                LIST_USAGE_INVALID_UL : LIST_USAGE_INVALID_OL;
            TY_(ReportAccessError)( doc, node, msgcode );
        }
    }
}